

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O1

bool __thiscall llvm::FoldingSetNodeID::operator<(FoldingSetNodeID *this,FoldingSetNodeIDRef RHS)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(this->Bits).super_SmallVectorImpl<unsigned_int>.
                 super_SmallVectorTemplateBase<unsigned_int,_true>.
                 super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
  if (uVar2 == RHS.Size) {
    iVar1 = memcmp((this->Bits).super_SmallVectorImpl<unsigned_int>.
                   super_SmallVectorTemplateBase<unsigned_int,_true>.
                   super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX,
                   RHS.Data,uVar2 << 2);
    return SUB41((uint)iVar1 >> 0x1f,0);
  }
  return uVar2 < RHS.Size;
}

Assistant:

bool FoldingSetNodeID::operator<(FoldingSetNodeIDRef RHS) const {
  return FoldingSetNodeIDRef(Bits.data(), Bits.size()) < RHS;
}